

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O1

GLenum glxewInit(void)

{
  ulong uVar1;
  Display *pDVar2;
  GLboolean *pGVar3;
  GLubyte *pGVar4;
  GLenum GVar5;
  GLubyte *start;
  GLuint i;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  int minor;
  int major;
  int local_38;
  int local_34;
  
  pDVar2 = (*__glewXGetCurrentDisplay)();
  if (pDVar2 == (Display *)0x0) {
    GVar5 = 4;
  }
  else {
    __glewXGetCurrentDisplay =
         (PFNGLXGETCURRENTDISPLAYPROC)glXGetProcAddressARB("glXGetCurrentDisplay");
    GVar5 = 3;
    if (__glewXGetCurrentDisplay != (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
      __GLXEW_VERSION_1_0 = '\x01';
      __GLXEW_VERSION_1_1 = '\x01';
      __GLXEW_VERSION_1_2 = '\x01';
      __GLXEW_VERSION_1_3 = '\x01';
      __GLXEW_VERSION_1_4 = '\x01';
      glXQueryVersion(pDVar2,&local_34,&local_38);
      if (local_38 < 4 && local_34 == 1) {
        if (local_38 == 3) {
          pGVar3 = &__GLXEW_VERSION_1_4;
        }
        else {
          if (local_38 != 2) {
            return 3;
          }
          __GLXEW_VERSION_1_4 = '\0';
          pGVar3 = &__GLXEW_VERSION_1_3;
        }
        *pGVar3 = '\0';
      }
      if (__glewXGetCurrentDisplay == (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
        pGVar4 = (GLubyte *)0x0;
      }
      else {
        pGVar4 = (GLubyte *)glXGetClientString(pDVar2,3);
      }
      start = "";
      uVar1 = 0;
      if (pGVar4 != (GLubyte *)0x0) {
        start = pGVar4;
      }
      do {
        uVar6 = uVar1;
        uVar1 = (ulong)((int)uVar6 + 1);
      } while (start[uVar6] != '\0');
      pGVar4 = start + uVar6;
      if (__GLXEW_VERSION_1_3 != '\0' || glewExperimental != '\0') {
        __glewXChooseFBConfig = (PFNGLXCHOOSEFBCONFIGPROC)glXGetProcAddressARB("glXChooseFBConfig");
        bVar7 = __glewXChooseFBConfig != (PFNGLXCHOOSEFBCONFIGPROC)0x0;
        __glewXCreateNewContext =
             (PFNGLXCREATENEWCONTEXTPROC)glXGetProcAddressARB("glXCreateNewContext");
        bVar8 = __glewXCreateNewContext != (PFNGLXCREATENEWCONTEXTPROC)0x0;
        __glewXCreatePbuffer = (PFNGLXCREATEPBUFFERPROC)glXGetProcAddressARB("glXCreatePbuffer");
        bVar9 = __glewXCreatePbuffer != (PFNGLXCREATEPBUFFERPROC)0x0;
        __glewXCreatePixmap = (PFNGLXCREATEPIXMAPPROC)glXGetProcAddressARB("glXCreatePixmap");
        bVar10 = __glewXCreatePixmap != (PFNGLXCREATEPIXMAPPROC)0x0;
        __glewXCreateWindow = (PFNGLXCREATEWINDOWPROC)glXGetProcAddressARB("glXCreateWindow");
        bVar11 = __glewXCreateWindow != (PFNGLXCREATEWINDOWPROC)0x0;
        __glewXDestroyPbuffer = (PFNGLXDESTROYPBUFFERPROC)glXGetProcAddressARB("glXDestroyPbuffer");
        bVar12 = __glewXDestroyPbuffer != (PFNGLXDESTROYPBUFFERPROC)0x0;
        __glewXDestroyPixmap = (PFNGLXDESTROYPIXMAPPROC)glXGetProcAddressARB("glXDestroyPixmap");
        bVar13 = __glewXDestroyPixmap != (PFNGLXDESTROYPIXMAPPROC)0x0;
        __glewXDestroyWindow = (PFNGLXDESTROYWINDOWPROC)glXGetProcAddressARB("glXDestroyWindow");
        bVar14 = __glewXDestroyWindow != (PFNGLXDESTROYWINDOWPROC)0x0;
        __glewXGetCurrentReadDrawable =
             (PFNGLXGETCURRENTREADDRAWABLEPROC)glXGetProcAddressARB("glXGetCurrentReadDrawable");
        bVar15 = __glewXGetCurrentReadDrawable != (PFNGLXGETCURRENTREADDRAWABLEPROC)0x0;
        __glewXGetFBConfigAttrib =
             (PFNGLXGETFBCONFIGATTRIBPROC)glXGetProcAddressARB("glXGetFBConfigAttrib");
        bVar16 = __glewXGetFBConfigAttrib != (PFNGLXGETFBCONFIGATTRIBPROC)0x0;
        __glewXGetFBConfigs = (PFNGLXGETFBCONFIGSPROC)glXGetProcAddressARB("glXGetFBConfigs");
        bVar17 = __glewXGetFBConfigs != (PFNGLXGETFBCONFIGSPROC)0x0;
        __glewXGetSelectedEvent =
             (PFNGLXGETSELECTEDEVENTPROC)glXGetProcAddressARB("glXGetSelectedEvent");
        bVar18 = __glewXGetSelectedEvent != (PFNGLXGETSELECTEDEVENTPROC)0x0;
        __glewXGetVisualFromFBConfig =
             (PFNGLXGETVISUALFROMFBCONFIGPROC)glXGetProcAddressARB("glXGetVisualFromFBConfig");
        bVar19 = __glewXGetVisualFromFBConfig != (PFNGLXGETVISUALFROMFBCONFIGPROC)0x0;
        __glewXMakeContextCurrent =
             (PFNGLXMAKECONTEXTCURRENTPROC)glXGetProcAddressARB("glXMakeContextCurrent");
        bVar20 = __glewXMakeContextCurrent != (PFNGLXMAKECONTEXTCURRENTPROC)0x0;
        __glewXQueryContext = (PFNGLXQUERYCONTEXTPROC)glXGetProcAddressARB("glXQueryContext");
        bVar21 = __glewXQueryContext != (PFNGLXQUERYCONTEXTPROC)0x0;
        __glewXQueryDrawable = (PFNGLXQUERYDRAWABLEPROC)glXGetProcAddressARB("glXQueryDrawable");
        bVar22 = __glewXQueryDrawable != (PFNGLXQUERYDRAWABLEPROC)0x0;
        __glewXSelectEvent = (PFNGLXSELECTEVENTPROC)glXGetProcAddressARB("glXSelectEvent");
        __GLXEW_VERSION_1_3 =
             (((((bVar12 && bVar11) && bVar10) && bVar9) && bVar8) &&
             ((((bVar16 && bVar15) && bVar14) && bVar13) &&
             (((bVar19 && bVar18) && bVar17) &&
             ((bVar21 && bVar20) && (__glewXSelectEvent != (PFNGLXSELECTEVENTPROC)0x0 && bVar22)))))
             && bVar7;
      }
      __GLXEW_3DFX_multisample = _glewSearchExtension("GLX_3DFX_multisample",start,pGVar4);
      __GLXEW_AMD_gpu_association = _glewSearchExtension("GLX_AMD_gpu_association",start,pGVar4);
      if (__GLXEW_AMD_gpu_association != '\0' || glewExperimental != '\0') {
        __glewXBlitContextFramebufferAMD =
             (PFNGLXBLITCONTEXTFRAMEBUFFERAMDPROC)
             glXGetProcAddressARB("glXBlitContextFramebufferAMD");
        bVar7 = __glewXBlitContextFramebufferAMD != (PFNGLXBLITCONTEXTFRAMEBUFFERAMDPROC)0x0;
        __glewXCreateAssociatedContextAMD =
             (PFNGLXCREATEASSOCIATEDCONTEXTAMDPROC)
             glXGetProcAddressARB("glXCreateAssociatedContextAMD");
        bVar8 = __glewXCreateAssociatedContextAMD != (PFNGLXCREATEASSOCIATEDCONTEXTAMDPROC)0x0;
        __glewXCreateAssociatedContextAttribsAMD =
             (PFNGLXCREATEASSOCIATEDCONTEXTATTRIBSAMDPROC)
             glXGetProcAddressARB("glXCreateAssociatedContextAttribsAMD");
        bVar9 = __glewXCreateAssociatedContextAttribsAMD !=
                (PFNGLXCREATEASSOCIATEDCONTEXTATTRIBSAMDPROC)0x0;
        __glewXDeleteAssociatedContextAMD =
             (PFNGLXDELETEASSOCIATEDCONTEXTAMDPROC)
             glXGetProcAddressARB("glXDeleteAssociatedContextAMD");
        bVar10 = __glewXDeleteAssociatedContextAMD != (PFNGLXDELETEASSOCIATEDCONTEXTAMDPROC)0x0;
        __glewXGetContextGPUIDAMD =
             (PFNGLXGETCONTEXTGPUIDAMDPROC)glXGetProcAddressARB("glXGetContextGPUIDAMD");
        bVar11 = __glewXGetContextGPUIDAMD != (PFNGLXGETCONTEXTGPUIDAMDPROC)0x0;
        __glewXGetCurrentAssociatedContextAMD =
             (PFNGLXGETCURRENTASSOCIATEDCONTEXTAMDPROC)
             glXGetProcAddressARB("glXGetCurrentAssociatedContextAMD");
        bVar12 = __glewXGetCurrentAssociatedContextAMD !=
                 (PFNGLXGETCURRENTASSOCIATEDCONTEXTAMDPROC)0x0;
        __glewXGetGPUIDsAMD = (PFNGLXGETGPUIDSAMDPROC)glXGetProcAddressARB("glXGetGPUIDsAMD");
        bVar13 = __glewXGetGPUIDsAMD != (PFNGLXGETGPUIDSAMDPROC)0x0;
        __glewXGetGPUInfoAMD = (PFNGLXGETGPUINFOAMDPROC)glXGetProcAddressARB("glXGetGPUInfoAMD");
        bVar14 = __glewXGetGPUInfoAMD != (PFNGLXGETGPUINFOAMDPROC)0x0;
        __glewXMakeAssociatedContextCurrentAMD =
             (PFNGLXMAKEASSOCIATEDCONTEXTCURRENTAMDPROC)
             glXGetProcAddressARB("glXMakeAssociatedContextCurrentAMD");
        __GLXEW_AMD_gpu_association =
             (bVar8 && bVar7) &&
             (((bVar11 && bVar10) && bVar9) &&
             ((bVar13 && bVar12) &&
             (__glewXMakeAssociatedContextCurrentAMD !=
              (PFNGLXMAKEASSOCIATEDCONTEXTCURRENTAMDPROC)0x0 && bVar14)));
      }
      __GLXEW_ARB_context_flush_control =
           _glewSearchExtension("GLX_ARB_context_flush_control",start,pGVar4);
      __GLXEW_ARB_create_context = _glewSearchExtension("GLX_ARB_create_context",start,pGVar4);
      if (__GLXEW_ARB_create_context != '\0' || glewExperimental != '\0') {
        __glewXCreateContextAttribsARB =
             (PFNGLXCREATECONTEXTATTRIBSARBPROC)glXGetProcAddressARB("glXCreateContextAttribsARB");
        __GLXEW_ARB_create_context =
             __glewXCreateContextAttribsARB != (PFNGLXCREATECONTEXTATTRIBSARBPROC)0x0;
      }
      __GLXEW_ARB_create_context_profile =
           _glewSearchExtension("GLX_ARB_create_context_profile",start,pGVar4);
      __GLXEW_ARB_create_context_robustness =
           _glewSearchExtension("GLX_ARB_create_context_robustness",start,pGVar4);
      __GLXEW_ARB_fbconfig_float = _glewSearchExtension("GLX_ARB_fbconfig_float",start,pGVar4);
      __GLXEW_ARB_framebuffer_sRGB = _glewSearchExtension("GLX_ARB_framebuffer_sRGB",start,pGVar4);
      __GLXEW_ARB_get_proc_address = _glewSearchExtension("GLX_ARB_get_proc_address",start,pGVar4);
      __GLXEW_ARB_multisample = _glewSearchExtension("GLX_ARB_multisample",start,pGVar4);
      __GLXEW_ARB_robustness_application_isolation =
           _glewSearchExtension("GLX_ARB_robustness_application_isolation",start,pGVar4);
      __GLXEW_ARB_robustness_share_group_isolation =
           _glewSearchExtension("GLX_ARB_robustness_share_group_isolation",start,pGVar4);
      __GLXEW_ARB_vertex_buffer_object =
           _glewSearchExtension("GLX_ARB_vertex_buffer_object",start,pGVar4);
      __GLXEW_ATI_pixel_format_float =
           _glewSearchExtension("GLX_ATI_pixel_format_float",start,pGVar4);
      __GLXEW_ATI_render_texture = _glewSearchExtension("GLX_ATI_render_texture",start,pGVar4);
      if (__GLXEW_ATI_render_texture != '\0' || glewExperimental != '\0') {
        __glewXBindTexImageATI =
             (PFNGLXBINDTEXIMAGEATIPROC)glXGetProcAddressARB("glXBindTexImageATI");
        bVar7 = __glewXBindTexImageATI != (PFNGLXBINDTEXIMAGEATIPROC)0x0;
        __glewXDrawableAttribATI =
             (PFNGLXDRAWABLEATTRIBATIPROC)glXGetProcAddressARB("glXDrawableAttribATI");
        bVar8 = __glewXDrawableAttribATI != (PFNGLXDRAWABLEATTRIBATIPROC)0x0;
        __glewXReleaseTexImageATI =
             (PFNGLXRELEASETEXIMAGEATIPROC)glXGetProcAddressARB("glXReleaseTexImageATI");
        __GLXEW_ATI_render_texture =
             (__glewXReleaseTexImageATI != (PFNGLXRELEASETEXIMAGEATIPROC)0x0 && bVar8) && bVar7;
      }
      __GLXEW_EXT_buffer_age = _glewSearchExtension("GLX_EXT_buffer_age",start,pGVar4);
      __GLXEW_EXT_create_context_es2_profile =
           _glewSearchExtension("GLX_EXT_create_context_es2_profile",start,pGVar4);
      __GLXEW_EXT_create_context_es_profile =
           _glewSearchExtension("GLX_EXT_create_context_es_profile",start,pGVar4);
      __GLXEW_EXT_fbconfig_packed_float =
           _glewSearchExtension("GLX_EXT_fbconfig_packed_float",start,pGVar4);
      __GLXEW_EXT_framebuffer_sRGB = _glewSearchExtension("GLX_EXT_framebuffer_sRGB",start,pGVar4);
      __GLXEW_EXT_import_context = _glewSearchExtension("GLX_EXT_import_context",start,pGVar4);
      if (__GLXEW_EXT_import_context != '\0' || glewExperimental != '\0') {
        __glewXFreeContextEXT = (PFNGLXFREECONTEXTEXTPROC)glXGetProcAddressARB("glXFreeContextEXT");
        bVar7 = __glewXFreeContextEXT != (PFNGLXFREECONTEXTEXTPROC)0x0;
        __glewXGetContextIDEXT =
             (PFNGLXGETCONTEXTIDEXTPROC)glXGetProcAddressARB("glXGetContextIDEXT");
        bVar8 = __glewXGetContextIDEXT != (PFNGLXGETCONTEXTIDEXTPROC)0x0;
        __glewXImportContextEXT =
             (PFNGLXIMPORTCONTEXTEXTPROC)glXGetProcAddressARB("glXImportContextEXT");
        bVar9 = __glewXImportContextEXT != (PFNGLXIMPORTCONTEXTEXTPROC)0x0;
        __glewXQueryContextInfoEXT =
             (PFNGLXQUERYCONTEXTINFOEXTPROC)glXGetProcAddressARB("glXQueryContextInfoEXT");
        __GLXEW_EXT_import_context =
             (bVar8 && bVar7) &&
             (__glewXQueryContextInfoEXT != (PFNGLXQUERYCONTEXTINFOEXTPROC)0x0 && bVar9);
      }
      __GLXEW_EXT_libglvnd = _glewSearchExtension("GLX_EXT_libglvnd",start,pGVar4);
      __GLXEW_EXT_scene_marker = _glewSearchExtension("GLX_EXT_scene_marker",start,pGVar4);
      __GLXEW_EXT_stereo_tree = _glewSearchExtension("GLX_EXT_stereo_tree",start,pGVar4);
      __GLXEW_EXT_swap_control = _glewSearchExtension("GLX_EXT_swap_control",start,pGVar4);
      if (__GLXEW_EXT_swap_control != '\0' || glewExperimental != '\0') {
        __glewXSwapIntervalEXT =
             (PFNGLXSWAPINTERVALEXTPROC)glXGetProcAddressARB("glXSwapIntervalEXT");
        __GLXEW_EXT_swap_control = __glewXSwapIntervalEXT != (PFNGLXSWAPINTERVALEXTPROC)0x0;
      }
      __GLXEW_EXT_swap_control_tear = _glewSearchExtension("GLX_EXT_swap_control_tear",start,pGVar4)
      ;
      __GLXEW_EXT_texture_from_pixmap =
           _glewSearchExtension("GLX_EXT_texture_from_pixmap",start,pGVar4);
      if (__GLXEW_EXT_texture_from_pixmap != '\0' || glewExperimental != '\0') {
        __glewXBindTexImageEXT =
             (PFNGLXBINDTEXIMAGEEXTPROC)glXGetProcAddressARB("glXBindTexImageEXT");
        bVar7 = __glewXBindTexImageEXT != (PFNGLXBINDTEXIMAGEEXTPROC)0x0;
        __glewXReleaseTexImageEXT =
             (PFNGLXRELEASETEXIMAGEEXTPROC)glXGetProcAddressARB("glXReleaseTexImageEXT");
        __GLXEW_EXT_texture_from_pixmap =
             __glewXReleaseTexImageEXT != (PFNGLXRELEASETEXIMAGEEXTPROC)0x0 && bVar7;
      }
      __GLXEW_EXT_visual_info = _glewSearchExtension("GLX_EXT_visual_info",start,pGVar4);
      __GLXEW_EXT_visual_rating = _glewSearchExtension("GLX_EXT_visual_rating",start,pGVar4);
      __GLXEW_INTEL_swap_event = _glewSearchExtension("GLX_INTEL_swap_event",start,pGVar4);
      __GLXEW_MESA_agp_offset = _glewSearchExtension("GLX_MESA_agp_offset",start,pGVar4);
      if (__GLXEW_MESA_agp_offset != '\0' || glewExperimental != '\0') {
        __glewXGetAGPOffsetMESA =
             (PFNGLXGETAGPOFFSETMESAPROC)glXGetProcAddressARB("glXGetAGPOffsetMESA");
        __GLXEW_MESA_agp_offset = __glewXGetAGPOffsetMESA != (PFNGLXGETAGPOFFSETMESAPROC)0x0;
      }
      __GLXEW_MESA_copy_sub_buffer = _glewSearchExtension("GLX_MESA_copy_sub_buffer",start,pGVar4);
      if (__GLXEW_MESA_copy_sub_buffer != '\0' || glewExperimental != '\0') {
        __glewXCopySubBufferMESA =
             (PFNGLXCOPYSUBBUFFERMESAPROC)glXGetProcAddressARB("glXCopySubBufferMESA");
        __GLXEW_MESA_copy_sub_buffer = __glewXCopySubBufferMESA != (PFNGLXCOPYSUBBUFFERMESAPROC)0x0;
      }
      __GLXEW_MESA_pixmap_colormap = _glewSearchExtension("GLX_MESA_pixmap_colormap",start,pGVar4);
      if (__GLXEW_MESA_pixmap_colormap != '\0' || glewExperimental != '\0') {
        __glewXCreateGLXPixmapMESA =
             (PFNGLXCREATEGLXPIXMAPMESAPROC)glXGetProcAddressARB("glXCreateGLXPixmapMESA");
        __GLXEW_MESA_pixmap_colormap =
             __glewXCreateGLXPixmapMESA != (PFNGLXCREATEGLXPIXMAPMESAPROC)0x0;
      }
      __GLXEW_MESA_query_renderer = _glewSearchExtension("GLX_MESA_query_renderer",start,pGVar4);
      if (__GLXEW_MESA_query_renderer != '\0' || glewExperimental != '\0') {
        __glewXQueryCurrentRendererIntegerMESA =
             (PFNGLXQUERYCURRENTRENDERERINTEGERMESAPROC)
             glXGetProcAddressARB("glXQueryCurrentRendererIntegerMESA");
        bVar7 = __glewXQueryCurrentRendererIntegerMESA !=
                (PFNGLXQUERYCURRENTRENDERERINTEGERMESAPROC)0x0;
        __glewXQueryCurrentRendererStringMESA =
             (PFNGLXQUERYCURRENTRENDERERSTRINGMESAPROC)
             glXGetProcAddressARB("glXQueryCurrentRendererStringMESA");
        bVar8 = __glewXQueryCurrentRendererStringMESA !=
                (PFNGLXQUERYCURRENTRENDERERSTRINGMESAPROC)0x0;
        __glewXQueryRendererIntegerMESA =
             (PFNGLXQUERYRENDERERINTEGERMESAPROC)glXGetProcAddressARB("glXQueryRendererIntegerMESA")
        ;
        bVar9 = __glewXQueryRendererIntegerMESA != (PFNGLXQUERYRENDERERINTEGERMESAPROC)0x0;
        __glewXQueryRendererStringMESA =
             (PFNGLXQUERYRENDERERSTRINGMESAPROC)glXGetProcAddressARB("glXQueryRendererStringMESA");
        __GLXEW_MESA_query_renderer =
             (bVar8 && bVar7) &&
             (__glewXQueryRendererStringMESA != (PFNGLXQUERYRENDERERSTRINGMESAPROC)0x0 && bVar9);
      }
      __GLXEW_MESA_release_buffers = _glewSearchExtension("GLX_MESA_release_buffers",start,pGVar4);
      if (__GLXEW_MESA_release_buffers != '\0' || glewExperimental != '\0') {
        __glewXReleaseBuffersMESA =
             (PFNGLXRELEASEBUFFERSMESAPROC)glXGetProcAddressARB("glXReleaseBuffersMESA");
        __GLXEW_MESA_release_buffers =
             __glewXReleaseBuffersMESA != (PFNGLXRELEASEBUFFERSMESAPROC)0x0;
      }
      __GLXEW_MESA_set_3dfx_mode = _glewSearchExtension("GLX_MESA_set_3dfx_mode",start,pGVar4);
      if (__GLXEW_MESA_set_3dfx_mode != '\0' || glewExperimental != '\0') {
        __glewXSet3DfxModeMESA =
             (PFNGLXSET3DFXMODEMESAPROC)glXGetProcAddressARB("glXSet3DfxModeMESA");
        __GLXEW_MESA_set_3dfx_mode = __glewXSet3DfxModeMESA != (PFNGLXSET3DFXMODEMESAPROC)0x0;
      }
      __GLXEW_MESA_swap_control = _glewSearchExtension("GLX_MESA_swap_control",start,pGVar4);
      if (__GLXEW_MESA_swap_control != '\0' || glewExperimental != '\0') {
        __glewXGetSwapIntervalMESA =
             (PFNGLXGETSWAPINTERVALMESAPROC)glXGetProcAddressARB("glXGetSwapIntervalMESA");
        bVar7 = __glewXGetSwapIntervalMESA != (PFNGLXGETSWAPINTERVALMESAPROC)0x0;
        __glewXSwapIntervalMESA =
             (PFNGLXSWAPINTERVALMESAPROC_conflict)glXGetProcAddressARB("glXSwapIntervalMESA");
        __GLXEW_MESA_swap_control =
             __glewXSwapIntervalMESA != (PFNGLXSWAPINTERVALMESAPROC_conflict)0x0 && bVar7;
      }
      __GLXEW_NV_copy_buffer = _glewSearchExtension("GLX_NV_copy_buffer",start,pGVar4);
      if (__GLXEW_NV_copy_buffer != '\0' || glewExperimental != '\0') {
        __glewXCopyBufferSubDataNV =
             (PFNGLXCOPYBUFFERSUBDATANVPROC)glXGetProcAddressARB("glXCopyBufferSubDataNV");
        bVar7 = __glewXCopyBufferSubDataNV != (PFNGLXCOPYBUFFERSUBDATANVPROC)0x0;
        __glewXNamedCopyBufferSubDataNV =
             (PFNGLXNAMEDCOPYBUFFERSUBDATANVPROC)glXGetProcAddressARB("glXNamedCopyBufferSubDataNV")
        ;
        __GLXEW_NV_copy_buffer =
             __glewXNamedCopyBufferSubDataNV != (PFNGLXNAMEDCOPYBUFFERSUBDATANVPROC)0x0 && bVar7;
      }
      __GLXEW_NV_copy_image = _glewSearchExtension("GLX_NV_copy_image",start,pGVar4);
      if (__GLXEW_NV_copy_image != '\0' || glewExperimental != '\0') {
        __glewXCopyImageSubDataNV =
             (PFNGLXCOPYIMAGESUBDATANVPROC)glXGetProcAddressARB("glXCopyImageSubDataNV");
        __GLXEW_NV_copy_image = __glewXCopyImageSubDataNV != (PFNGLXCOPYIMAGESUBDATANVPROC)0x0;
      }
      __GLXEW_NV_delay_before_swap = _glewSearchExtension("GLX_NV_delay_before_swap",start,pGVar4);
      if (__GLXEW_NV_delay_before_swap != '\0' || glewExperimental != '\0') {
        __glewXDelayBeforeSwapNV =
             (PFNGLXDELAYBEFORESWAPNVPROC)glXGetProcAddressARB("glXDelayBeforeSwapNV");
        __GLXEW_NV_delay_before_swap = __glewXDelayBeforeSwapNV != (PFNGLXDELAYBEFORESWAPNVPROC)0x0;
      }
      __GLXEW_NV_float_buffer = _glewSearchExtension("GLX_NV_float_buffer",start,pGVar4);
      __GLXEW_NV_multisample_coverage =
           _glewSearchExtension("GLX_NV_multisample_coverage",start,pGVar4);
      __GLXEW_NV_present_video = _glewSearchExtension("GLX_NV_present_video",start,pGVar4);
      if (__GLXEW_NV_present_video != '\0' || glewExperimental != '\0') {
        __glewXBindVideoDeviceNV =
             (PFNGLXBINDVIDEODEVICENVPROC)glXGetProcAddressARB("glXBindVideoDeviceNV");
        bVar7 = __glewXBindVideoDeviceNV != (PFNGLXBINDVIDEODEVICENVPROC)0x0;
        __glewXEnumerateVideoDevicesNV =
             (PFNGLXENUMERATEVIDEODEVICESNVPROC)glXGetProcAddressARB("glXEnumerateVideoDevicesNV");
        __GLXEW_NV_present_video =
             __glewXEnumerateVideoDevicesNV != (PFNGLXENUMERATEVIDEODEVICESNVPROC)0x0 && bVar7;
      }
      __GLXEW_NV_robustness_video_memory_purge =
           _glewSearchExtension("GLX_NV_robustness_video_memory_purge",start,pGVar4);
      __GLXEW_NV_swap_group = _glewSearchExtension("GLX_NV_swap_group",start,pGVar4);
      if (__GLXEW_NV_swap_group != '\0' || glewExperimental != '\0') {
        __glewXBindSwapBarrierNV =
             (PFNGLXBINDSWAPBARRIERNVPROC)glXGetProcAddressARB("glXBindSwapBarrierNV");
        bVar7 = __glewXBindSwapBarrierNV != (PFNGLXBINDSWAPBARRIERNVPROC)0x0;
        __glewXJoinSwapGroupNV =
             (PFNGLXJOINSWAPGROUPNVPROC)glXGetProcAddressARB("glXJoinSwapGroupNV");
        bVar8 = __glewXJoinSwapGroupNV != (PFNGLXJOINSWAPGROUPNVPROC)0x0;
        __glewXQueryFrameCountNV =
             (PFNGLXQUERYFRAMECOUNTNVPROC)glXGetProcAddressARB("glXQueryFrameCountNV");
        bVar9 = __glewXQueryFrameCountNV != (PFNGLXQUERYFRAMECOUNTNVPROC)0x0;
        __glewXQueryMaxSwapGroupsNV =
             (PFNGLXQUERYMAXSWAPGROUPSNVPROC)glXGetProcAddressARB("glXQueryMaxSwapGroupsNV");
        bVar10 = __glewXQueryMaxSwapGroupsNV != (PFNGLXQUERYMAXSWAPGROUPSNVPROC)0x0;
        __glewXQuerySwapGroupNV =
             (PFNGLXQUERYSWAPGROUPNVPROC)glXGetProcAddressARB("glXQuerySwapGroupNV");
        bVar11 = __glewXQuerySwapGroupNV != (PFNGLXQUERYSWAPGROUPNVPROC)0x0;
        __glewXResetFrameCountNV =
             (PFNGLXRESETFRAMECOUNTNVPROC)glXGetProcAddressARB("glXResetFrameCountNV");
        __GLXEW_NV_swap_group =
             (bVar8 && bVar7) &&
             ((bVar10 && bVar9) &&
             (__glewXResetFrameCountNV != (PFNGLXRESETFRAMECOUNTNVPROC)0x0 && bVar11));
      }
      __GLXEW_NV_vertex_array_range = _glewSearchExtension("GLX_NV_vertex_array_range",start,pGVar4)
      ;
      if (__GLXEW_NV_vertex_array_range != '\0' || glewExperimental != '\0') {
        __glewXAllocateMemoryNV =
             (PFNGLXALLOCATEMEMORYNVPROC)glXGetProcAddressARB("glXAllocateMemoryNV");
        bVar7 = __glewXAllocateMemoryNV != (PFNGLXALLOCATEMEMORYNVPROC)0x0;
        __glewXFreeMemoryNV = (PFNGLXFREEMEMORYNVPROC)glXGetProcAddressARB("glXFreeMemoryNV");
        __GLXEW_NV_vertex_array_range = __glewXFreeMemoryNV != (PFNGLXFREEMEMORYNVPROC)0x0 && bVar7;
      }
      __GLXEW_NV_video_capture = _glewSearchExtension("GLX_NV_video_capture",start,pGVar4);
      if (__GLXEW_NV_video_capture != '\0' || glewExperimental != '\0') {
        __glewXBindVideoCaptureDeviceNV =
             (PFNGLXBINDVIDEOCAPTUREDEVICENVPROC)glXGetProcAddressARB("glXBindVideoCaptureDeviceNV")
        ;
        bVar7 = __glewXBindVideoCaptureDeviceNV != (PFNGLXBINDVIDEOCAPTUREDEVICENVPROC)0x0;
        __glewXEnumerateVideoCaptureDevicesNV =
             (PFNGLXENUMERATEVIDEOCAPTUREDEVICESNVPROC)
             glXGetProcAddressARB("glXEnumerateVideoCaptureDevicesNV");
        bVar8 = __glewXEnumerateVideoCaptureDevicesNV !=
                (PFNGLXENUMERATEVIDEOCAPTUREDEVICESNVPROC)0x0;
        __glewXLockVideoCaptureDeviceNV =
             (PFNGLXLOCKVIDEOCAPTUREDEVICENVPROC)glXGetProcAddressARB("glXLockVideoCaptureDeviceNV")
        ;
        bVar9 = __glewXLockVideoCaptureDeviceNV != (PFNGLXLOCKVIDEOCAPTUREDEVICENVPROC)0x0;
        __glewXQueryVideoCaptureDeviceNV =
             (PFNGLXQUERYVIDEOCAPTUREDEVICENVPROC)
             glXGetProcAddressARB("glXQueryVideoCaptureDeviceNV");
        bVar10 = __glewXQueryVideoCaptureDeviceNV != (PFNGLXQUERYVIDEOCAPTUREDEVICENVPROC)0x0;
        __glewXReleaseVideoCaptureDeviceNV =
             (PFNGLXRELEASEVIDEOCAPTUREDEVICENVPROC)
             glXGetProcAddressARB("glXReleaseVideoCaptureDeviceNV");
        __GLXEW_NV_video_capture =
             ((bVar9 && bVar8) &&
             (__glewXReleaseVideoCaptureDeviceNV != (PFNGLXRELEASEVIDEOCAPTUREDEVICENVPROC)0x0 &&
             bVar10)) && bVar7;
      }
      __GLXEW_NV_video_out = _glewSearchExtension("GLX_NV_video_out",start,pGVar4);
      if (__GLXEW_NV_video_out != '\0' || glewExperimental != '\0') {
        __glewXBindVideoImageNV =
             (PFNGLXBINDVIDEOIMAGENVPROC)glXGetProcAddressARB("glXBindVideoImageNV");
        bVar7 = __glewXBindVideoImageNV != (PFNGLXBINDVIDEOIMAGENVPROC)0x0;
        __glewXGetVideoDeviceNV =
             (PFNGLXGETVIDEODEVICENVPROC)glXGetProcAddressARB("glXGetVideoDeviceNV");
        bVar8 = __glewXGetVideoDeviceNV != (PFNGLXGETVIDEODEVICENVPROC)0x0;
        __glewXGetVideoInfoNV = (PFNGLXGETVIDEOINFONVPROC)glXGetProcAddressARB("glXGetVideoInfoNV");
        bVar9 = __glewXGetVideoInfoNV != (PFNGLXGETVIDEOINFONVPROC)0x0;
        __glewXReleaseVideoDeviceNV =
             (PFNGLXRELEASEVIDEODEVICENVPROC)glXGetProcAddressARB("glXReleaseVideoDeviceNV");
        bVar10 = __glewXReleaseVideoDeviceNV != (PFNGLXRELEASEVIDEODEVICENVPROC)0x0;
        __glewXReleaseVideoImageNV =
             (PFNGLXRELEASEVIDEOIMAGENVPROC)glXGetProcAddressARB("glXReleaseVideoImageNV");
        bVar11 = __glewXReleaseVideoImageNV != (PFNGLXRELEASEVIDEOIMAGENVPROC)0x0;
        __glewXSendPbufferToVideoNV =
             (PFNGLXSENDPBUFFERTOVIDEONVPROC)glXGetProcAddressARB("glXSendPbufferToVideoNV");
        __GLXEW_NV_video_out =
             (bVar8 && bVar7) &&
             ((bVar10 && bVar9) &&
             (__glewXSendPbufferToVideoNV != (PFNGLXSENDPBUFFERTOVIDEONVPROC)0x0 && bVar11));
      }
      __GLXEW_OML_swap_method = _glewSearchExtension("GLX_OML_swap_method",start,pGVar4);
      __GLXEW_OML_sync_control = _glewSearchExtension("GLX_OML_sync_control",start,pGVar4);
      if (__GLXEW_OML_sync_control != '\0' || glewExperimental != '\0') {
        __glewXGetMscRateOML = (PFNGLXGETMSCRATEOMLPROC)glXGetProcAddressARB("glXGetMscRateOML");
        bVar7 = __glewXGetMscRateOML != (PFNGLXGETMSCRATEOMLPROC)0x0;
        __glewXGetSyncValuesOML =
             (PFNGLXGETSYNCVALUESOMLPROC)glXGetProcAddressARB("glXGetSyncValuesOML");
        bVar8 = __glewXGetSyncValuesOML != (PFNGLXGETSYNCVALUESOMLPROC)0x0;
        __glewXSwapBuffersMscOML =
             (PFNGLXSWAPBUFFERSMSCOMLPROC)glXGetProcAddressARB("glXSwapBuffersMscOML");
        bVar9 = __glewXSwapBuffersMscOML != (PFNGLXSWAPBUFFERSMSCOMLPROC)0x0;
        __glewXWaitForMscOML = (PFNGLXWAITFORMSCOMLPROC)glXGetProcAddressARB("glXWaitForMscOML");
        bVar10 = __glewXWaitForMscOML != (PFNGLXWAITFORMSCOMLPROC)0x0;
        __glewXWaitForSbcOML = (PFNGLXWAITFORSBCOMLPROC)glXGetProcAddressARB("glXWaitForSbcOML");
        __GLXEW_OML_sync_control =
             ((bVar9 && bVar8) && (__glewXWaitForSbcOML != (PFNGLXWAITFORSBCOMLPROC)0x0 && bVar10))
             && bVar7;
      }
      __GLXEW_SGIS_blended_overlay = _glewSearchExtension("GLX_SGIS_blended_overlay",start,pGVar4);
      __GLXEW_SGIS_color_range = _glewSearchExtension("GLX_SGIS_color_range",start,pGVar4);
      __GLXEW_SGIS_multisample = _glewSearchExtension("GLX_SGIS_multisample",start,pGVar4);
      __GLXEW_SGIS_shared_multisample =
           _glewSearchExtension("GLX_SGIS_shared_multisample",start,pGVar4);
      __GLXEW_SGIX_fbconfig = _glewSearchExtension("GLX_SGIX_fbconfig",start,pGVar4);
      if (__GLXEW_SGIX_fbconfig != '\0' || glewExperimental != '\0') {
        __glewXChooseFBConfigSGIX =
             (PFNGLXCHOOSEFBCONFIGSGIXPROC)glXGetProcAddressARB("glXChooseFBConfigSGIX");
        bVar7 = __glewXChooseFBConfigSGIX != (PFNGLXCHOOSEFBCONFIGSGIXPROC)0x0;
        __glewXCreateContextWithConfigSGIX =
             (PFNGLXCREATECONTEXTWITHCONFIGSGIXPROC)
             glXGetProcAddressARB("glXCreateContextWithConfigSGIX");
        bVar8 = __glewXCreateContextWithConfigSGIX != (PFNGLXCREATECONTEXTWITHCONFIGSGIXPROC)0x0;
        __glewXCreateGLXPixmapWithConfigSGIX =
             (PFNGLXCREATEGLXPIXMAPWITHCONFIGSGIXPROC)
             glXGetProcAddressARB("glXCreateGLXPixmapWithConfigSGIX");
        bVar9 = __glewXCreateGLXPixmapWithConfigSGIX != (PFNGLXCREATEGLXPIXMAPWITHCONFIGSGIXPROC)0x0
        ;
        __glewXGetFBConfigAttribSGIX =
             (PFNGLXGETFBCONFIGATTRIBSGIXPROC)glXGetProcAddressARB("glXGetFBConfigAttribSGIX");
        bVar10 = __glewXGetFBConfigAttribSGIX != (PFNGLXGETFBCONFIGATTRIBSGIXPROC)0x0;
        __glewXGetFBConfigFromVisualSGIX =
             (PFNGLXGETFBCONFIGFROMVISUALSGIXPROC)
             glXGetProcAddressARB("glXGetFBConfigFromVisualSGIX");
        bVar11 = __glewXGetFBConfigFromVisualSGIX != (PFNGLXGETFBCONFIGFROMVISUALSGIXPROC)0x0;
        __glewXGetVisualFromFBConfigSGIX =
             (PFNGLXGETVISUALFROMFBCONFIGSGIXPROC)
             glXGetProcAddressARB("glXGetVisualFromFBConfigSGIX");
        __GLXEW_SGIX_fbconfig =
             (bVar8 && bVar7) &&
             ((bVar10 && bVar9) &&
             (__glewXGetVisualFromFBConfigSGIX != (PFNGLXGETVISUALFROMFBCONFIGSGIXPROC)0x0 && bVar11
             ));
      }
      __GLXEW_SGIX_hyperpipe = _glewSearchExtension("GLX_SGIX_hyperpipe",start,pGVar4);
      if (__GLXEW_SGIX_hyperpipe != '\0' || glewExperimental != '\0') {
        __glewXBindHyperpipeSGIX =
             (PFNGLXBINDHYPERPIPESGIXPROC)glXGetProcAddressARB("glXBindHyperpipeSGIX");
        bVar7 = __glewXBindHyperpipeSGIX != (PFNGLXBINDHYPERPIPESGIXPROC)0x0;
        __glewXDestroyHyperpipeConfigSGIX =
             (PFNGLXDESTROYHYPERPIPECONFIGSGIXPROC)
             glXGetProcAddressARB("glXDestroyHyperpipeConfigSGIX");
        bVar8 = __glewXDestroyHyperpipeConfigSGIX != (PFNGLXDESTROYHYPERPIPECONFIGSGIXPROC)0x0;
        __glewXHyperpipeAttribSGIX =
             (PFNGLXHYPERPIPEATTRIBSGIXPROC)glXGetProcAddressARB("glXHyperpipeAttribSGIX");
        bVar9 = __glewXHyperpipeAttribSGIX != (PFNGLXHYPERPIPEATTRIBSGIXPROC)0x0;
        __glewXHyperpipeConfigSGIX =
             (PFNGLXHYPERPIPECONFIGSGIXPROC)glXGetProcAddressARB("glXHyperpipeConfigSGIX");
        bVar10 = __glewXHyperpipeConfigSGIX != (PFNGLXHYPERPIPECONFIGSGIXPROC)0x0;
        __glewXQueryHyperpipeAttribSGIX =
             (PFNGLXQUERYHYPERPIPEATTRIBSGIXPROC)glXGetProcAddressARB("glXQueryHyperpipeAttribSGIX")
        ;
        bVar11 = __glewXQueryHyperpipeAttribSGIX != (PFNGLXQUERYHYPERPIPEATTRIBSGIXPROC)0x0;
        __glewXQueryHyperpipeBestAttribSGIX =
             (PFNGLXQUERYHYPERPIPEBESTATTRIBSGIXPROC)
             glXGetProcAddressARB("glXQueryHyperpipeBestAttribSGIX");
        bVar12 = __glewXQueryHyperpipeBestAttribSGIX != (PFNGLXQUERYHYPERPIPEBESTATTRIBSGIXPROC)0x0;
        __glewXQueryHyperpipeConfigSGIX =
             (PFNGLXQUERYHYPERPIPECONFIGSGIXPROC)glXGetProcAddressARB("glXQueryHyperpipeConfigSGIX")
        ;
        bVar13 = __glewXQueryHyperpipeConfigSGIX != (PFNGLXQUERYHYPERPIPECONFIGSGIXPROC)0x0;
        __glewXQueryHyperpipeNetworkSGIX =
             (PFNGLXQUERYHYPERPIPENETWORKSGIXPROC)
             glXGetProcAddressARB("glXQueryHyperpipeNetworkSGIX");
        __GLXEW_SGIX_hyperpipe =
             (((bVar10 && bVar9) && bVar8) &&
             ((bVar12 && bVar11) &&
             (__glewXQueryHyperpipeNetworkSGIX != (PFNGLXQUERYHYPERPIPENETWORKSGIXPROC)0x0 && bVar13
             ))) && bVar7;
      }
      __GLXEW_SGIX_pbuffer = _glewSearchExtension("GLX_SGIX_pbuffer",start,pGVar4);
      if (__GLXEW_SGIX_pbuffer != '\0' || glewExperimental != '\0') {
        __glewXCreateGLXPbufferSGIX =
             (PFNGLXCREATEGLXPBUFFERSGIXPROC)glXGetProcAddressARB("glXCreateGLXPbufferSGIX");
        bVar7 = __glewXCreateGLXPbufferSGIX != (PFNGLXCREATEGLXPBUFFERSGIXPROC)0x0;
        __glewXDestroyGLXPbufferSGIX =
             (PFNGLXDESTROYGLXPBUFFERSGIXPROC)glXGetProcAddressARB("glXDestroyGLXPbufferSGIX");
        bVar8 = __glewXDestroyGLXPbufferSGIX != (PFNGLXDESTROYGLXPBUFFERSGIXPROC)0x0;
        __glewXGetSelectedEventSGIX =
             (PFNGLXGETSELECTEDEVENTSGIXPROC)glXGetProcAddressARB("glXGetSelectedEventSGIX");
        bVar9 = __glewXGetSelectedEventSGIX != (PFNGLXGETSELECTEDEVENTSGIXPROC)0x0;
        __glewXQueryGLXPbufferSGIX =
             (PFNGLXQUERYGLXPBUFFERSGIXPROC)glXGetProcAddressARB("glXQueryGLXPbufferSGIX");
        bVar10 = __glewXQueryGLXPbufferSGIX != (PFNGLXQUERYGLXPBUFFERSGIXPROC)0x0;
        __glewXSelectEventSGIX =
             (PFNGLXSELECTEVENTSGIXPROC)glXGetProcAddressARB("glXSelectEventSGIX");
        __GLXEW_SGIX_pbuffer =
             ((bVar9 && bVar8) &&
             (__glewXSelectEventSGIX != (PFNGLXSELECTEVENTSGIXPROC)0x0 && bVar10)) && bVar7;
      }
      __GLXEW_SGIX_swap_barrier = _glewSearchExtension("GLX_SGIX_swap_barrier",start,pGVar4);
      if (__GLXEW_SGIX_swap_barrier != '\0' || glewExperimental != '\0') {
        __glewXBindSwapBarrierSGIX =
             (PFNGLXBINDSWAPBARRIERSGIXPROC)glXGetProcAddressARB("glXBindSwapBarrierSGIX");
        bVar7 = __glewXBindSwapBarrierSGIX != (PFNGLXBINDSWAPBARRIERSGIXPROC)0x0;
        __glewXQueryMaxSwapBarriersSGIX =
             (PFNGLXQUERYMAXSWAPBARRIERSSGIXPROC)glXGetProcAddressARB("glXQueryMaxSwapBarriersSGIX")
        ;
        __GLXEW_SGIX_swap_barrier =
             __glewXQueryMaxSwapBarriersSGIX != (PFNGLXQUERYMAXSWAPBARRIERSSGIXPROC)0x0 && bVar7;
      }
      __GLXEW_SGIX_swap_group = _glewSearchExtension("GLX_SGIX_swap_group",start,pGVar4);
      if (__GLXEW_SGIX_swap_group != '\0' || glewExperimental != '\0') {
        __glewXJoinSwapGroupSGIX =
             (PFNGLXJOINSWAPGROUPSGIXPROC)glXGetProcAddressARB("glXJoinSwapGroupSGIX");
        __GLXEW_SGIX_swap_group = __glewXJoinSwapGroupSGIX != (PFNGLXJOINSWAPGROUPSGIXPROC)0x0;
      }
      __GLXEW_SGIX_video_resize = _glewSearchExtension("GLX_SGIX_video_resize",start,pGVar4);
      if (__GLXEW_SGIX_video_resize != '\0' || glewExperimental != '\0') {
        __glewXBindChannelToWindowSGIX =
             (PFNGLXBINDCHANNELTOWINDOWSGIXPROC)glXGetProcAddressARB("glXBindChannelToWindowSGIX");
        bVar7 = __glewXBindChannelToWindowSGIX != (PFNGLXBINDCHANNELTOWINDOWSGIXPROC)0x0;
        __glewXChannelRectSGIX =
             (PFNGLXCHANNELRECTSGIXPROC)glXGetProcAddressARB("glXChannelRectSGIX");
        bVar8 = __glewXChannelRectSGIX != (PFNGLXCHANNELRECTSGIXPROC)0x0;
        __glewXChannelRectSyncSGIX =
             (PFNGLXCHANNELRECTSYNCSGIXPROC)glXGetProcAddressARB("glXChannelRectSyncSGIX");
        bVar9 = __glewXChannelRectSyncSGIX != (PFNGLXCHANNELRECTSYNCSGIXPROC)0x0;
        __glewXQueryChannelDeltasSGIX =
             (PFNGLXQUERYCHANNELDELTASSGIXPROC)glXGetProcAddressARB("glXQueryChannelDeltasSGIX");
        bVar10 = __glewXQueryChannelDeltasSGIX != (PFNGLXQUERYCHANNELDELTASSGIXPROC)0x0;
        __glewXQueryChannelRectSGIX =
             (PFNGLXQUERYCHANNELRECTSGIXPROC)glXGetProcAddressARB("glXQueryChannelRectSGIX");
        __GLXEW_SGIX_video_resize =
             ((bVar9 && bVar8) &&
             (__glewXQueryChannelRectSGIX != (PFNGLXQUERYCHANNELRECTSGIXPROC)0x0 && bVar10)) &&
             bVar7;
      }
      __GLXEW_SGIX_visual_select_group =
           _glewSearchExtension("GLX_SGIX_visual_select_group",start,pGVar4);
      __GLXEW_SGI_cushion = _glewSearchExtension("GLX_SGI_cushion",start,pGVar4);
      if (__GLXEW_SGI_cushion != '\0' || glewExperimental != '\0') {
        __glewXCushionSGI = (PFNGLXCUSHIONSGIPROC)glXGetProcAddressARB("glXCushionSGI");
        __GLXEW_SGI_cushion = __glewXCushionSGI != (PFNGLXCUSHIONSGIPROC)0x0;
      }
      __GLXEW_SGI_make_current_read = _glewSearchExtension("GLX_SGI_make_current_read",start,pGVar4)
      ;
      if (__GLXEW_SGI_make_current_read != '\0' || glewExperimental != '\0') {
        __glewXGetCurrentReadDrawableSGI =
             (PFNGLXGETCURRENTREADDRAWABLESGIPROC)
             glXGetProcAddressARB("glXGetCurrentReadDrawableSGI");
        bVar7 = __glewXGetCurrentReadDrawableSGI != (PFNGLXGETCURRENTREADDRAWABLESGIPROC)0x0;
        __glewXMakeCurrentReadSGI =
             (PFNGLXMAKECURRENTREADSGIPROC)glXGetProcAddressARB("glXMakeCurrentReadSGI");
        __GLXEW_SGI_make_current_read =
             __glewXMakeCurrentReadSGI != (PFNGLXMAKECURRENTREADSGIPROC)0x0 && bVar7;
      }
      __GLXEW_SGI_swap_control = _glewSearchExtension("GLX_SGI_swap_control",start,pGVar4);
      if (__GLXEW_SGI_swap_control != '\0' || glewExperimental != '\0') {
        __glewXSwapIntervalSGI =
             (PFNGLXSWAPINTERVALSGIPROC)glXGetProcAddressARB("glXSwapIntervalSGI");
        __GLXEW_SGI_swap_control = __glewXSwapIntervalSGI != (PFNGLXSWAPINTERVALSGIPROC)0x0;
      }
      __GLXEW_SGI_video_sync = _glewSearchExtension("GLX_SGI_video_sync",start,pGVar4);
      if (__GLXEW_SGI_video_sync != '\0' || glewExperimental != '\0') {
        __glewXGetVideoSyncSGI =
             (PFNGLXGETVIDEOSYNCSGIPROC)glXGetProcAddressARB("glXGetVideoSyncSGI");
        bVar7 = __glewXGetVideoSyncSGI != (PFNGLXGETVIDEOSYNCSGIPROC)0x0;
        __glewXWaitVideoSyncSGI =
             (PFNGLXWAITVIDEOSYNCSGIPROC)glXGetProcAddressARB("glXWaitVideoSyncSGI");
        __GLXEW_SGI_video_sync = __glewXWaitVideoSyncSGI != (PFNGLXWAITVIDEOSYNCSGIPROC)0x0 && bVar7
        ;
      }
      __GLXEW_SUN_get_transparent_index =
           _glewSearchExtension("GLX_SUN_get_transparent_index",start,pGVar4);
      if (__GLXEW_SUN_get_transparent_index != '\0' || glewExperimental != '\0') {
        __glewXGetTransparentIndexSUN =
             (PFNGLXGETTRANSPARENTINDEXSUNPROC)glXGetProcAddressARB("glXGetTransparentIndexSUN");
        __GLXEW_SUN_get_transparent_index =
             __glewXGetTransparentIndexSUN != (PFNGLXGETTRANSPARENTINDEXSUNPROC)0x0;
      }
      __GLXEW_SUN_video_resize = _glewSearchExtension("GLX_SUN_video_resize",start,pGVar4);
      GVar5 = 0;
      if (__GLXEW_SUN_video_resize != '\0' || glewExperimental != '\0') {
        __glewXGetVideoResizeSUN =
             (PFNGLXGETVIDEORESIZESUNPROC)glXGetProcAddressARB("glXGetVideoResizeSUN");
        bVar7 = __glewXGetVideoResizeSUN != (PFNGLXGETVIDEORESIZESUNPROC)0x0;
        __glewXVideoResizeSUN = (PFNGLXVIDEORESIZESUNPROC)glXGetProcAddressARB("glXVideoResizeSUN");
        __GLXEW_SUN_video_resize = __glewXVideoResizeSUN != (PFNGLXVIDEORESIZESUNPROC)0x0 && bVar7;
        GVar5 = 0;
      }
    }
  }
  return GVar5;
}

Assistant:

GLenum glxewInit ()
{
  Display* display;
  int major, minor;
  const GLubyte* extStart;
  const GLubyte* extEnd;
  /* check for a display */
  display = glXGetCurrentDisplay();
  if (display == NULL) return GLEW_ERROR_NO_GLX_DISPLAY;
  /* initialize core GLX 1.2 */
  if (_glewInit_GLX_VERSION_1_2()) return GLEW_ERROR_GLX_VERSION_11_ONLY;
  /* initialize flags */
  GLXEW_VERSION_1_0 = GL_TRUE;
  GLXEW_VERSION_1_1 = GL_TRUE;
  GLXEW_VERSION_1_2 = GL_TRUE;
  GLXEW_VERSION_1_3 = GL_TRUE;
  GLXEW_VERSION_1_4 = GL_TRUE;
  /* query GLX version */
  glXQueryVersion(display, &major, &minor);
  if (major == 1 && minor <= 3)
  {
    switch (minor)
    {
      case 3:
      GLXEW_VERSION_1_4 = GL_FALSE;
      break;
      case 2:
      GLXEW_VERSION_1_4 = GL_FALSE;
      GLXEW_VERSION_1_3 = GL_FALSE;
      break;
      default:
      return GLEW_ERROR_GLX_VERSION_11_ONLY;
      break;
    }
  }
  /* query GLX extension string */
  extStart = 0;
  if (glXGetCurrentDisplay != NULL)
    extStart = (const GLubyte*)glXGetClientString(display, GLX_EXTENSIONS);
  if (extStart == 0)
    extStart = (const GLubyte *)"";
  extEnd = extStart + _glewStrLen(extStart);
  /* initialize extensions */
#ifdef GLX_VERSION_1_3
  if (glewExperimental || GLXEW_VERSION_1_3) GLXEW_VERSION_1_3 = !_glewInit_GLX_VERSION_1_3();
#endif /* GLX_VERSION_1_3 */
#ifdef GLX_3DFX_multisample
  GLXEW_3DFX_multisample = _glewSearchExtension("GLX_3DFX_multisample", extStart, extEnd);
#endif /* GLX_3DFX_multisample */
#ifdef GLX_AMD_gpu_association
  GLXEW_AMD_gpu_association = _glewSearchExtension("GLX_AMD_gpu_association", extStart, extEnd);
  if (glewExperimental || GLXEW_AMD_gpu_association) GLXEW_AMD_gpu_association = !_glewInit_GLX_AMD_gpu_association();
#endif /* GLX_AMD_gpu_association */
#ifdef GLX_ARB_context_flush_control
  GLXEW_ARB_context_flush_control = _glewSearchExtension("GLX_ARB_context_flush_control", extStart, extEnd);
#endif /* GLX_ARB_context_flush_control */
#ifdef GLX_ARB_create_context
  GLXEW_ARB_create_context = _glewSearchExtension("GLX_ARB_create_context", extStart, extEnd);
  if (glewExperimental || GLXEW_ARB_create_context) GLXEW_ARB_create_context = !_glewInit_GLX_ARB_create_context();
#endif /* GLX_ARB_create_context */
#ifdef GLX_ARB_create_context_profile
  GLXEW_ARB_create_context_profile = _glewSearchExtension("GLX_ARB_create_context_profile", extStart, extEnd);
#endif /* GLX_ARB_create_context_profile */
#ifdef GLX_ARB_create_context_robustness
  GLXEW_ARB_create_context_robustness = _glewSearchExtension("GLX_ARB_create_context_robustness", extStart, extEnd);
#endif /* GLX_ARB_create_context_robustness */
#ifdef GLX_ARB_fbconfig_float
  GLXEW_ARB_fbconfig_float = _glewSearchExtension("GLX_ARB_fbconfig_float", extStart, extEnd);
#endif /* GLX_ARB_fbconfig_float */
#ifdef GLX_ARB_framebuffer_sRGB
  GLXEW_ARB_framebuffer_sRGB = _glewSearchExtension("GLX_ARB_framebuffer_sRGB", extStart, extEnd);
#endif /* GLX_ARB_framebuffer_sRGB */
#ifdef GLX_ARB_get_proc_address
  GLXEW_ARB_get_proc_address = _glewSearchExtension("GLX_ARB_get_proc_address", extStart, extEnd);
#endif /* GLX_ARB_get_proc_address */
#ifdef GLX_ARB_multisample
  GLXEW_ARB_multisample = _glewSearchExtension("GLX_ARB_multisample", extStart, extEnd);
#endif /* GLX_ARB_multisample */
#ifdef GLX_ARB_robustness_application_isolation
  GLXEW_ARB_robustness_application_isolation = _glewSearchExtension("GLX_ARB_robustness_application_isolation", extStart, extEnd);
#endif /* GLX_ARB_robustness_application_isolation */
#ifdef GLX_ARB_robustness_share_group_isolation
  GLXEW_ARB_robustness_share_group_isolation = _glewSearchExtension("GLX_ARB_robustness_share_group_isolation", extStart, extEnd);
#endif /* GLX_ARB_robustness_share_group_isolation */
#ifdef GLX_ARB_vertex_buffer_object
  GLXEW_ARB_vertex_buffer_object = _glewSearchExtension("GLX_ARB_vertex_buffer_object", extStart, extEnd);
#endif /* GLX_ARB_vertex_buffer_object */
#ifdef GLX_ATI_pixel_format_float
  GLXEW_ATI_pixel_format_float = _glewSearchExtension("GLX_ATI_pixel_format_float", extStart, extEnd);
#endif /* GLX_ATI_pixel_format_float */
#ifdef GLX_ATI_render_texture
  GLXEW_ATI_render_texture = _glewSearchExtension("GLX_ATI_render_texture", extStart, extEnd);
  if (glewExperimental || GLXEW_ATI_render_texture) GLXEW_ATI_render_texture = !_glewInit_GLX_ATI_render_texture();
#endif /* GLX_ATI_render_texture */
#ifdef GLX_EXT_buffer_age
  GLXEW_EXT_buffer_age = _glewSearchExtension("GLX_EXT_buffer_age", extStart, extEnd);
#endif /* GLX_EXT_buffer_age */
#ifdef GLX_EXT_create_context_es2_profile
  GLXEW_EXT_create_context_es2_profile = _glewSearchExtension("GLX_EXT_create_context_es2_profile", extStart, extEnd);
#endif /* GLX_EXT_create_context_es2_profile */
#ifdef GLX_EXT_create_context_es_profile
  GLXEW_EXT_create_context_es_profile = _glewSearchExtension("GLX_EXT_create_context_es_profile", extStart, extEnd);
#endif /* GLX_EXT_create_context_es_profile */
#ifdef GLX_EXT_fbconfig_packed_float
  GLXEW_EXT_fbconfig_packed_float = _glewSearchExtension("GLX_EXT_fbconfig_packed_float", extStart, extEnd);
#endif /* GLX_EXT_fbconfig_packed_float */
#ifdef GLX_EXT_framebuffer_sRGB
  GLXEW_EXT_framebuffer_sRGB = _glewSearchExtension("GLX_EXT_framebuffer_sRGB", extStart, extEnd);
#endif /* GLX_EXT_framebuffer_sRGB */
#ifdef GLX_EXT_import_context
  GLXEW_EXT_import_context = _glewSearchExtension("GLX_EXT_import_context", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_import_context) GLXEW_EXT_import_context = !_glewInit_GLX_EXT_import_context();
#endif /* GLX_EXT_import_context */
#ifdef GLX_EXT_libglvnd
  GLXEW_EXT_libglvnd = _glewSearchExtension("GLX_EXT_libglvnd", extStart, extEnd);
#endif /* GLX_EXT_libglvnd */
#ifdef GLX_EXT_scene_marker
  GLXEW_EXT_scene_marker = _glewSearchExtension("GLX_EXT_scene_marker", extStart, extEnd);
#endif /* GLX_EXT_scene_marker */
#ifdef GLX_EXT_stereo_tree
  GLXEW_EXT_stereo_tree = _glewSearchExtension("GLX_EXT_stereo_tree", extStart, extEnd);
#endif /* GLX_EXT_stereo_tree */
#ifdef GLX_EXT_swap_control
  GLXEW_EXT_swap_control = _glewSearchExtension("GLX_EXT_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_swap_control) GLXEW_EXT_swap_control = !_glewInit_GLX_EXT_swap_control();
#endif /* GLX_EXT_swap_control */
#ifdef GLX_EXT_swap_control_tear
  GLXEW_EXT_swap_control_tear = _glewSearchExtension("GLX_EXT_swap_control_tear", extStart, extEnd);
#endif /* GLX_EXT_swap_control_tear */
#ifdef GLX_EXT_texture_from_pixmap
  GLXEW_EXT_texture_from_pixmap = _glewSearchExtension("GLX_EXT_texture_from_pixmap", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_texture_from_pixmap) GLXEW_EXT_texture_from_pixmap = !_glewInit_GLX_EXT_texture_from_pixmap();
#endif /* GLX_EXT_texture_from_pixmap */
#ifdef GLX_EXT_visual_info
  GLXEW_EXT_visual_info = _glewSearchExtension("GLX_EXT_visual_info", extStart, extEnd);
#endif /* GLX_EXT_visual_info */
#ifdef GLX_EXT_visual_rating
  GLXEW_EXT_visual_rating = _glewSearchExtension("GLX_EXT_visual_rating", extStart, extEnd);
#endif /* GLX_EXT_visual_rating */
#ifdef GLX_INTEL_swap_event
  GLXEW_INTEL_swap_event = _glewSearchExtension("GLX_INTEL_swap_event", extStart, extEnd);
#endif /* GLX_INTEL_swap_event */
#ifdef GLX_MESA_agp_offset
  GLXEW_MESA_agp_offset = _glewSearchExtension("GLX_MESA_agp_offset", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_agp_offset) GLXEW_MESA_agp_offset = !_glewInit_GLX_MESA_agp_offset();
#endif /* GLX_MESA_agp_offset */
#ifdef GLX_MESA_copy_sub_buffer
  GLXEW_MESA_copy_sub_buffer = _glewSearchExtension("GLX_MESA_copy_sub_buffer", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_copy_sub_buffer) GLXEW_MESA_copy_sub_buffer = !_glewInit_GLX_MESA_copy_sub_buffer();
#endif /* GLX_MESA_copy_sub_buffer */
#ifdef GLX_MESA_pixmap_colormap
  GLXEW_MESA_pixmap_colormap = _glewSearchExtension("GLX_MESA_pixmap_colormap", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_pixmap_colormap) GLXEW_MESA_pixmap_colormap = !_glewInit_GLX_MESA_pixmap_colormap();
#endif /* GLX_MESA_pixmap_colormap */
#ifdef GLX_MESA_query_renderer
  GLXEW_MESA_query_renderer = _glewSearchExtension("GLX_MESA_query_renderer", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_query_renderer) GLXEW_MESA_query_renderer = !_glewInit_GLX_MESA_query_renderer();
#endif /* GLX_MESA_query_renderer */
#ifdef GLX_MESA_release_buffers
  GLXEW_MESA_release_buffers = _glewSearchExtension("GLX_MESA_release_buffers", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_release_buffers) GLXEW_MESA_release_buffers = !_glewInit_GLX_MESA_release_buffers();
#endif /* GLX_MESA_release_buffers */
#ifdef GLX_MESA_set_3dfx_mode
  GLXEW_MESA_set_3dfx_mode = _glewSearchExtension("GLX_MESA_set_3dfx_mode", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_set_3dfx_mode) GLXEW_MESA_set_3dfx_mode = !_glewInit_GLX_MESA_set_3dfx_mode();
#endif /* GLX_MESA_set_3dfx_mode */
#ifdef GLX_MESA_swap_control
  GLXEW_MESA_swap_control = _glewSearchExtension("GLX_MESA_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_swap_control) GLXEW_MESA_swap_control = !_glewInit_GLX_MESA_swap_control();
#endif /* GLX_MESA_swap_control */
#ifdef GLX_NV_copy_buffer
  GLXEW_NV_copy_buffer = _glewSearchExtension("GLX_NV_copy_buffer", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_copy_buffer) GLXEW_NV_copy_buffer = !_glewInit_GLX_NV_copy_buffer();
#endif /* GLX_NV_copy_buffer */
#ifdef GLX_NV_copy_image
  GLXEW_NV_copy_image = _glewSearchExtension("GLX_NV_copy_image", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_copy_image) GLXEW_NV_copy_image = !_glewInit_GLX_NV_copy_image();
#endif /* GLX_NV_copy_image */
#ifdef GLX_NV_delay_before_swap
  GLXEW_NV_delay_before_swap = _glewSearchExtension("GLX_NV_delay_before_swap", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_delay_before_swap) GLXEW_NV_delay_before_swap = !_glewInit_GLX_NV_delay_before_swap();
#endif /* GLX_NV_delay_before_swap */
#ifdef GLX_NV_float_buffer
  GLXEW_NV_float_buffer = _glewSearchExtension("GLX_NV_float_buffer", extStart, extEnd);
#endif /* GLX_NV_float_buffer */
#ifdef GLX_NV_multisample_coverage
  GLXEW_NV_multisample_coverage = _glewSearchExtension("GLX_NV_multisample_coverage", extStart, extEnd);
#endif /* GLX_NV_multisample_coverage */
#ifdef GLX_NV_present_video
  GLXEW_NV_present_video = _glewSearchExtension("GLX_NV_present_video", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_present_video) GLXEW_NV_present_video = !_glewInit_GLX_NV_present_video();
#endif /* GLX_NV_present_video */
#ifdef GLX_NV_robustness_video_memory_purge
  GLXEW_NV_robustness_video_memory_purge = _glewSearchExtension("GLX_NV_robustness_video_memory_purge", extStart, extEnd);
#endif /* GLX_NV_robustness_video_memory_purge */
#ifdef GLX_NV_swap_group
  GLXEW_NV_swap_group = _glewSearchExtension("GLX_NV_swap_group", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_swap_group) GLXEW_NV_swap_group = !_glewInit_GLX_NV_swap_group();
#endif /* GLX_NV_swap_group */
#ifdef GLX_NV_vertex_array_range
  GLXEW_NV_vertex_array_range = _glewSearchExtension("GLX_NV_vertex_array_range", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_vertex_array_range) GLXEW_NV_vertex_array_range = !_glewInit_GLX_NV_vertex_array_range();
#endif /* GLX_NV_vertex_array_range */
#ifdef GLX_NV_video_capture
  GLXEW_NV_video_capture = _glewSearchExtension("GLX_NV_video_capture", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_video_capture) GLXEW_NV_video_capture = !_glewInit_GLX_NV_video_capture();
#endif /* GLX_NV_video_capture */
#ifdef GLX_NV_video_out
  GLXEW_NV_video_out = _glewSearchExtension("GLX_NV_video_out", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_video_out) GLXEW_NV_video_out = !_glewInit_GLX_NV_video_out();
#endif /* GLX_NV_video_out */
#ifdef GLX_OML_swap_method
  GLXEW_OML_swap_method = _glewSearchExtension("GLX_OML_swap_method", extStart, extEnd);
#endif /* GLX_OML_swap_method */
#ifdef GLX_OML_sync_control
  GLXEW_OML_sync_control = _glewSearchExtension("GLX_OML_sync_control", extStart, extEnd);
  if (glewExperimental || GLXEW_OML_sync_control) GLXEW_OML_sync_control = !_glewInit_GLX_OML_sync_control();
#endif /* GLX_OML_sync_control */
#ifdef GLX_SGIS_blended_overlay
  GLXEW_SGIS_blended_overlay = _glewSearchExtension("GLX_SGIS_blended_overlay", extStart, extEnd);
#endif /* GLX_SGIS_blended_overlay */
#ifdef GLX_SGIS_color_range
  GLXEW_SGIS_color_range = _glewSearchExtension("GLX_SGIS_color_range", extStart, extEnd);
#endif /* GLX_SGIS_color_range */
#ifdef GLX_SGIS_multisample
  GLXEW_SGIS_multisample = _glewSearchExtension("GLX_SGIS_multisample", extStart, extEnd);
#endif /* GLX_SGIS_multisample */
#ifdef GLX_SGIS_shared_multisample
  GLXEW_SGIS_shared_multisample = _glewSearchExtension("GLX_SGIS_shared_multisample", extStart, extEnd);
#endif /* GLX_SGIS_shared_multisample */
#ifdef GLX_SGIX_fbconfig
  GLXEW_SGIX_fbconfig = _glewSearchExtension("GLX_SGIX_fbconfig", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_fbconfig) GLXEW_SGIX_fbconfig = !_glewInit_GLX_SGIX_fbconfig();
#endif /* GLX_SGIX_fbconfig */
#ifdef GLX_SGIX_hyperpipe
  GLXEW_SGIX_hyperpipe = _glewSearchExtension("GLX_SGIX_hyperpipe", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_hyperpipe) GLXEW_SGIX_hyperpipe = !_glewInit_GLX_SGIX_hyperpipe();
#endif /* GLX_SGIX_hyperpipe */
#ifdef GLX_SGIX_pbuffer
  GLXEW_SGIX_pbuffer = _glewSearchExtension("GLX_SGIX_pbuffer", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_pbuffer) GLXEW_SGIX_pbuffer = !_glewInit_GLX_SGIX_pbuffer();
#endif /* GLX_SGIX_pbuffer */
#ifdef GLX_SGIX_swap_barrier
  GLXEW_SGIX_swap_barrier = _glewSearchExtension("GLX_SGIX_swap_barrier", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_swap_barrier) GLXEW_SGIX_swap_barrier = !_glewInit_GLX_SGIX_swap_barrier();
#endif /* GLX_SGIX_swap_barrier */
#ifdef GLX_SGIX_swap_group
  GLXEW_SGIX_swap_group = _glewSearchExtension("GLX_SGIX_swap_group", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_swap_group) GLXEW_SGIX_swap_group = !_glewInit_GLX_SGIX_swap_group();
#endif /* GLX_SGIX_swap_group */
#ifdef GLX_SGIX_video_resize
  GLXEW_SGIX_video_resize = _glewSearchExtension("GLX_SGIX_video_resize", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_video_resize) GLXEW_SGIX_video_resize = !_glewInit_GLX_SGIX_video_resize();
#endif /* GLX_SGIX_video_resize */
#ifdef GLX_SGIX_visual_select_group
  GLXEW_SGIX_visual_select_group = _glewSearchExtension("GLX_SGIX_visual_select_group", extStart, extEnd);
#endif /* GLX_SGIX_visual_select_group */
#ifdef GLX_SGI_cushion
  GLXEW_SGI_cushion = _glewSearchExtension("GLX_SGI_cushion", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_cushion) GLXEW_SGI_cushion = !_glewInit_GLX_SGI_cushion();
#endif /* GLX_SGI_cushion */
#ifdef GLX_SGI_make_current_read
  GLXEW_SGI_make_current_read = _glewSearchExtension("GLX_SGI_make_current_read", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_make_current_read) GLXEW_SGI_make_current_read = !_glewInit_GLX_SGI_make_current_read();
#endif /* GLX_SGI_make_current_read */
#ifdef GLX_SGI_swap_control
  GLXEW_SGI_swap_control = _glewSearchExtension("GLX_SGI_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_swap_control) GLXEW_SGI_swap_control = !_glewInit_GLX_SGI_swap_control();
#endif /* GLX_SGI_swap_control */
#ifdef GLX_SGI_video_sync
  GLXEW_SGI_video_sync = _glewSearchExtension("GLX_SGI_video_sync", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_video_sync) GLXEW_SGI_video_sync = !_glewInit_GLX_SGI_video_sync();
#endif /* GLX_SGI_video_sync */
#ifdef GLX_SUN_get_transparent_index
  GLXEW_SUN_get_transparent_index = _glewSearchExtension("GLX_SUN_get_transparent_index", extStart, extEnd);
  if (glewExperimental || GLXEW_SUN_get_transparent_index) GLXEW_SUN_get_transparent_index = !_glewInit_GLX_SUN_get_transparent_index();
#endif /* GLX_SUN_get_transparent_index */
#ifdef GLX_SUN_video_resize
  GLXEW_SUN_video_resize = _glewSearchExtension("GLX_SUN_video_resize", extStart, extEnd);
  if (glewExperimental || GLXEW_SUN_video_resize) GLXEW_SUN_video_resize = !_glewInit_GLX_SUN_video_resize();
#endif /* GLX_SUN_video_resize */

  return GLEW_OK;
}